

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *window)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  uint uVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  ImVec2 *ref_pos_00;
  ImGuiPopupPositionPolicy policy;
  ImGuiContext *g;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImVec2 ref_pos;
  ImRect r_outer;
  ImVec2 local_50;
  ImRect local_48;
  ImRect local_38;
  undefined1 local_28 [16];
  
  pIVar5 = GImGui;
  IVar1 = (GImGui->Style).DisplaySafeAreaPadding;
  IVar2 = (GImGui->IO).DisplaySize;
  fVar6 = IVar1.x;
  fVar7 = IVar1.y;
  fVar8 = IVar2.x;
  fVar9 = IVar2.y;
  local_38.Max.x = (float)((uint)-fVar6 & -(uint)(fVar6 + fVar6 < fVar8));
  local_38.Max.y = (float)((uint)-fVar7 & -(uint)(fVar7 + fVar7 < fVar9));
  local_38.Min.x = 0.0 - local_38.Max.x;
  local_38.Min.y = 0.0 - local_38.Max.y;
  local_38.Max.x = local_38.Max.x + fVar8;
  local_38.Max.y = local_38.Max.y + fVar9;
  uVar3 = window->Flags;
  if ((uVar3 >> 0x1c & 1) == 0) {
    if ((uVar3 >> 0x1a & 1) != 0) {
      local_48.Max.x = (window->Pos).x;
      local_48.Max.y = (window->Pos).y;
      local_48.Min.x = local_48.Max.x + -1.0;
      local_48.Min.y = local_48.Max.y + -1.0;
      local_48.Max.x = local_48.Max.x + 1.0;
      local_48.Max.y = local_48.Max.y + 1.0;
      goto LAB_001292c4;
    }
    if ((uVar3 >> 0x19 & 1) == 0) {
      fVar6 = (window->Pos).x;
      fVar7 = (window->Pos).y;
      goto LAB_001292df;
    }
    local_28 = ZEXT416((uint)(GImGui->Style).MouseCursorScale);
    local_50 = NavCalcPreferredRefPos();
    local_48.Min.x = local_50.x;
    local_48.Min.y = local_50.y;
    if (((pIVar5->NavDisableHighlight == false) && (pIVar5->NavDisableMouseHover == true)) &&
       (((pIVar5->IO).ConfigFlags & 4) == 0)) {
      local_48.Max.x = local_48.Min.x + 16.0;
      local_48.Max.y = local_48.Min.y + 8.0;
    }
    else {
      local_48.Max.x = local_48.Min.x + (float)local_28._0_4_ * 24.0;
      local_48.Max.y = (float)local_28._0_4_ * 24.0 + local_48.Min.y;
    }
    local_48.Min.x = local_48.Min.x + -16.0;
    local_48.Min.y = local_48.Min.y + -8.0;
    ref_pos_00 = &local_50;
    policy = ImGuiPopupPositionPolicy_Tooltip;
  }
  else {
    pIVar4 = (GImGui->CurrentWindowStack).Data[(long)(GImGui->CurrentWindowStack).Size + -2];
    fVar6 = (GImGui->Style).ItemInnerSpacing.x;
    if ((pIVar4->DC).MenuBarAppending == true) {
      local_48.Min.y = (pIVar4->ClipRect).Min.y;
      local_48.Max.y = (pIVar4->ClipRect).Max.y;
      local_48.Max.x = 3.4028235e+38;
      local_48.Min.x = -3.4028235e+38;
    }
    else {
      fVar7 = (pIVar4->Pos).x;
      local_48.Min.x = fVar6 + fVar7;
      local_48.Max.x = ((fVar7 + (pIVar4->Size).x) - fVar6) - (pIVar4->ScrollbarSizes).x;
      local_48.Max.y = 3.4028235e+38;
      local_48.Min.y = -3.4028235e+38;
    }
LAB_001292c4:
    ref_pos_00 = &window->Pos;
    policy = ImGuiPopupPositionPolicy_Default;
  }
  IVar1 = FindBestWindowPosForPopupEx
                    (ref_pos_00,&window->Size,&window->AutoPosLastDirection,&local_38,&local_48,
                     policy);
  fVar6 = IVar1.x;
  fVar7 = IVar1.y;
LAB_001292df:
  IVar1.y = fVar7;
  IVar1.x = fVar6;
  return IVar1;
}

Assistant:

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    ImRect r_outer = GetWindowAllowedExtentRect(window);
    if (window->Flags & ImGuiWindowFlags_ChildMenu)
    {
        // Child menus typically request _any_ position within the parent menu item, and then we move the new menu outside the parent bounds.
        // This is how we end up with child menus appearing (most-commonly) on the right of the parent menu.
        IM_ASSERT(g.CurrentWindow == window);
        ImGuiWindow* parent_window = g.CurrentWindowStack[g.CurrentWindowStack.Size - 2];
        float horizontal_overlap = g.Style.ItemInnerSpacing.x; // We want some overlap to convey the relative depth of each menu (currently the amount of overlap is hard-coded to style.ItemSpacing.x).
        ImRect r_avoid;
        if (parent_window->DC.MenuBarAppending)
            r_avoid = ImRect(-FLT_MAX, parent_window->ClipRect.Min.y, FLT_MAX, parent_window->ClipRect.Max.y); // Avoid parent menu-bar. If we wanted multi-line menu-bar, we may instead want to have the calling window setup e.g. a NextWindowData.PosConstraintAvoidRect field
        else
            r_avoid = ImRect(parent_window->Pos.x + horizontal_overlap, -FLT_MAX, parent_window->Pos.x + parent_window->Size.x - horizontal_overlap - parent_window->ScrollbarSizes.x, FLT_MAX);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid, ImGuiPopupPositionPolicy_Default);
    }
    if (window->Flags & ImGuiWindowFlags_Popup)
    {
        ImRect r_avoid = ImRect(window->Pos.x - 1, window->Pos.y - 1, window->Pos.x + 1, window->Pos.y + 1);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid, ImGuiPopupPositionPolicy_Default);
    }
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Position tooltip (always follows mouse)
        float sc = g.Style.MouseCursorScale;
        ImVec2 ref_pos = NavCalcPreferredRefPos();
        ImRect r_avoid;
        if (!g.NavDisableHighlight && g.NavDisableMouseHover && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableSetMousePos))
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 16, ref_pos.y + 8);
        else
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 24 * sc, ref_pos.y + 24 * sc); // FIXME: Hard-coded based on mouse cursor shape expectation. Exact dimension not very important.
        return FindBestWindowPosForPopupEx(ref_pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid, ImGuiPopupPositionPolicy_Tooltip);
    }
    IM_ASSERT(0);
    return window->Pos;
}